

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ObjCheckMffc_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int Limit,Vec_Int_t *vNodes)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj_00;
  
  uVar3 = (uint)*(undefined8 *)pObj;
  if ((~uVar3 & 0x9fffffff) == 0) {
    iVar4 = 1;
  }
  else {
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaResub.c"
                    ,0x35,"int Gia_ObjCheckMffc_rec(Gia_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
    }
    iVar4 = Gia_ObjId(p,pObj);
    iVar4 = iVar4 - (*(uint *)pObj & 0x1fffffff);
    Vec_IntPush(vNodes,iVar4);
    piVar1 = p->pRefs + iVar4;
    *piVar1 = *piVar1 + -1;
    if ((*piVar1 != 0) ||
       ((iVar4 = 0, vNodes->nSize <= Limit &&
        (iVar5 = Gia_ObjCheckMffc_rec
                           (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),Limit,vNodes),
        iVar5 != 0)))) {
      iVar4 = Gia_ObjId(p,pObj);
      iVar4 = iVar4 - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
      Vec_IntPush(vNodes,iVar4);
      piVar1 = p->pRefs + iVar4;
      *piVar1 = *piVar1 + -1;
      if ((*piVar1 != 0) ||
         ((iVar4 = 0, vNodes->nSize <= Limit &&
          (iVar5 = Gia_ObjCheckMffc_rec
                             (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),Limit,vNodes
                             ), iVar5 != 0)))) {
        iVar4 = Gia_ObjId(p,pObj);
        puVar2 = p->pMuxes;
        if ((puVar2 != (uint *)0x0) && (puVar2[iVar4] != 0)) {
          iVar4 = Gia_ObjId(p,pObj);
          if (puVar2[iVar4] == 0) {
            iVar4 = -1;
          }
          else {
            puVar2 = p->pMuxes;
            iVar4 = Gia_ObjId(p,pObj);
            iVar4 = Abc_Lit2Var(puVar2[iVar4]);
          }
          Vec_IntPush(vNodes,iVar4);
          piVar1 = p->pRefs + iVar4;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            if (Limit < vNodes->nSize) {
              return 0;
            }
            puVar2 = p->pMuxes;
            if (puVar2 == (uint *)0x0) {
              pObj_00 = (Gia_Obj_t *)0x0;
            }
            else {
              iVar4 = Gia_ObjId(p,pObj);
              iVar4 = Abc_Lit2Var(puVar2[iVar4]);
              pObj_00 = Gia_ManObj(p,iVar4);
            }
            iVar4 = Gia_ObjCheckMffc_rec(p,pObj_00,Limit,vNodes);
            if (iVar4 == 0) {
              return 0;
            }
          }
        }
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes MFFCs of all qualifying nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ObjCheckMffc_rec( Gia_Man_t * p,Gia_Obj_t * pObj, int Limit, Vec_Int_t * vNodes )
{
    int iFanin;
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iFanin = Gia_ObjFaninId0p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin0(pObj), Limit, vNodes)) )
        return 0;
    iFanin = Gia_ObjFaninId1p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin1(pObj), Limit, vNodes)) )
        return 0;
    if ( !Gia_ObjIsMux(p, pObj) )
        return 1;
    iFanin = Gia_ObjFaninId2p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin2(p, pObj), Limit, vNodes)) )
        return 0;
    return 1;
}